

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::PricingSession::PricingSession(PricingSession *this,UserInfo *user_info)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  PricingSubscriber *this_01;
  PixieProvider *this_02;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  string local_48;
  
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_Subscribe_001e73f0;
  (this->super_Pricing)._vptr_Pricing = (_func_int **)&PTR_SetPriceUpdateEventCallback_001e7458;
  p_Var1 = &(this->subscriptions_)._M_t._M_impl.super__Rb_tree_header;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->provider_status_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->provider_status_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->provider_status_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->price_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->price_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->price_update_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::PriceUpdateEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subscription_status_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subscription_status_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subscription_status_callback_).
  super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->subscriptions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (Log == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"PricingSession","");
    tools::LoggerFactory::GetLogger((LoggerFactory *)&local_58,&local_48);
    p_Var2 = p_Stack_50;
    Log = local_58;
    this_00 = DAT_001ed980;
    local_58 = 0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    DAT_001ed980 = p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  this->user_info_ = user_info;
  this_01 = (PricingSubscriber *)operator_new(0x20);
  PricingSubscriber::PricingSubscriber(this_01,this,user_info);
  this->pricing_subscriber_ = this_01;
  this_02 = (PixieProvider *)operator_new(0x300);
  pixie::PixieProvider::PixieProvider(this_02,user_info);
  this->pixie_provider_ = (Provider *)this_02;
  LOCK();
  (this->running_)._M_base._M_i = false;
  UNLOCK();
  PrepareCallbacks(this);
  return;
}

Assistant:

PricingSession::PricingSession(UserInfo* user_info)
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("PricingSession");
    }

    user_info_ = user_info;
    pricing_subscriber_ = new PricingSubscriber(this, user_info);
    pixie_provider_ = new PixieProvider(user_info);
    running_ = ATOMIC_VAR_INIT(false);
    PrepareCallbacks();
}